

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O0

void TranslateModuleGlobalFunctionInformation(ExpressionTranslateContext *ctx)

{
  FunctionData *function_00;
  bool bVar1;
  uint uVar2;
  FunctionData **ppFVar3;
  bool isStatic;
  FunctionData *function;
  uint i;
  ExpressionTranslateContext *ctx_local;
  
  PrintIndentedLine(ctx,"// Register functions");
  for (function._4_4_ = 0; uVar2 = SmallArray<FunctionData_*,_128U>::size(&ctx->ctx->functions),
      function._4_4_ < uVar2; function._4_4_ = function._4_4_ + 1) {
    ppFVar3 = SmallArray<FunctionData_*,_128U>::operator[](&ctx->ctx->functions,function._4_4_);
    function_00 = *ppFVar3;
    bVar1 = ExpressionContext::IsGenericFunction(ctx->ctx,function_00);
    if (bVar1) {
      PrintIndentedLine(ctx,"__nullcFR[%d] = 0; // generic function \'%.*s\'",(ulong)function._4_4_,
                        (ulong)(uint)((int)(function_00->name->name).end -
                                     (int)(function_00->name->name).begin),
                        (function_00->name->name).begin);
    }
    else {
      if (((function_00->scope == ctx->ctx->globalScope) ||
          (function_00->scope->ownerNamespace != (NamespaceData *)0x0)) ||
         (function_00->scope->ownerType != (TypeBase *)0x0)) {
        if (*(function_00->name->name).begin == '$') {
          bVar1 = true;
        }
        else {
          bVar1 = (function_00->isHidden & 1U) != 0;
        }
      }
      else {
        bVar1 = true;
      }
      if ((bVar1) && (function_00->importModule != (ModuleData *)0x0)) {
        PrintIndentedLine(ctx,"__nullcFR[%d] = 0; // module \'%.*s\' internal function \'%.*s\'",
                          (ulong)function._4_4_,
                          (ulong)(uint)((int)(function_00->importModule->name).end -
                                       (int)(function_00->importModule->name).begin),
                          (function_00->importModule->name).begin,
                          (ulong)(uint)((int)(function_00->name->name).end -
                                       (int)(function_00->name->name).begin),
                          (function_00->name->name).begin);
      }
      else {
        PrintIndent(ctx);
        Print(ctx,"__nullcFR[%d] = __nullcRegisterFunction(\"",(ulong)function._4_4_);
        TranslateFunctionName(ctx,function_00);
        Print(ctx,"\", (void*)");
        TranslateFunctionName(ctx,function_00);
        bVar1 = UseNonStaticTemplate(ctx,function_00);
        if (bVar1) {
          Print(ctx,"<0>");
        }
        if (function_00->contextType == (TypeBase *)0x0) {
          Print(ctx,", -1");
        }
        else {
          Print(ctx,", __nullcTR[%d]",(ulong)function_00->contextType->typeIndex);
        }
        if (function_00->scope->ownerType == (TypeBase *)0x0) {
          if ((function_00->coroutine & 1U) == 0) {
            if ((TypeRef *)function_00->contextType == ctx->ctx->typeVoid->refType) {
              Print(ctx,", FunctionCategory::NORMAL");
            }
            else {
              Print(ctx,", FunctionCategory::LOCAL");
            }
          }
          else {
            Print(ctx,", FunctionCategory::COROUTINE");
          }
        }
        else {
          Print(ctx,", FunctionCategory::THISCALL");
        }
        if (*(function_00->name->name).begin == '$') {
          Print(ctx,", true);");
        }
        else {
          Print(ctx,", false);");
        }
        PrintLine(ctx);
      }
    }
  }
  PrintLine(ctx);
  return;
}

Assistant:

void TranslateModuleGlobalFunctionInformation(ExpressionTranslateContext &ctx)
{
	PrintIndentedLine(ctx, "// Register functions");

	for(unsigned i = 0; i < ctx.ctx.functions.size(); i++)
	{
		FunctionData *function = ctx.ctx.functions[i];

		if(ctx.ctx.IsGenericFunction(function))
		{
			PrintIndentedLine(ctx, "__nullcFR[%d] = 0; // generic function '%.*s'", i, FMT_ISTR(function->name->name));
			continue;
		}

		bool isStatic = false;

		if(function->scope != ctx.ctx.globalScope && !function->scope->ownerNamespace && !function->scope->ownerType)
			isStatic = true;
		else if(*function->name->name.begin == '$')
			isStatic = true;
		else if(function->isHidden)
			isStatic = true;

		if(isStatic && function->importModule)
		{
			PrintIndentedLine(ctx, "__nullcFR[%d] = 0; // module '%.*s' internal function '%.*s'", i, FMT_ISTR(function->importModule->name), FMT_ISTR(function->name->name));
			continue;
		}

		PrintIndent(ctx);
		Print(ctx, "__nullcFR[%d] = __nullcRegisterFunction(\"", i);
		TranslateFunctionName(ctx, function);
		Print(ctx, "\", (void*)");
		TranslateFunctionName(ctx, function);

		if(UseNonStaticTemplate(ctx, function))
			Print(ctx, "<0>");

		if(function->contextType)
			Print(ctx, ", __nullcTR[%d]", function->contextType->typeIndex);
		else
			Print(ctx, ", -1");

		if(function->scope->ownerType)
			Print(ctx, ", FunctionCategory::THISCALL");
		else if(function->coroutine)
			Print(ctx, ", FunctionCategory::COROUTINE");
		else if(function->contextType != ctx.ctx.typeVoid->refType)
			Print(ctx, ", FunctionCategory::LOCAL");
		else
			Print(ctx, ", FunctionCategory::NORMAL");

		if(*function->name->name.begin == '$')
			Print(ctx, ", true);");
		else
			Print(ctx, ", false);");

		PrintLine(ctx);
	}

	PrintLine(ctx);
}